

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall State::init(State *this,EVP_PKEY_CTX *ctx)

{
  reference pvVar1;
  float fVar2;
  vector<Ball,_std::allocator<Ball>_> *unaff_retaddr;
  value_type *ball;
  int i;
  int local_10;
  
  std::vector<Ball,_std::allocator<Ball>_>::resize(unaff_retaddr,(size_type)this);
  for (local_10 = 0; local_10 < (int)ctx; local_10 = local_10 + 1) {
    pvVar1 = std::vector<Ball,_std::allocator<Ball>_>::operator[](&this->balls,(long)local_10);
    fVar2 = frand();
    pvVar1->r = fVar2 * 0.05 + 0.02;
    pvVar1->m = pvVar1->r * pvVar1->r * pvVar1->r;
    fVar2 = frand();
    pvVar1->x = fVar2 + fVar2 + -1.0;
    fVar2 = frand();
    pvVar1->y = fVar2 + fVar2 + -1.0;
    fVar2 = frand();
    pvVar1->z = fVar2 + fVar2 + -1.0;
    fVar2 = frand();
    pvVar1->vx = fVar2 + fVar2 + -1.0;
    fVar2 = frand();
    pvVar1->vy = fVar2 + fVar2 + -1.0;
    fVar2 = frand();
    pvVar1->vz = fVar2 + fVar2 + -1.0;
  }
  return local_10;
}

Assistant:

void init(int nBalls) {
        balls.resize(nBalls);
        for (int i = 0; i < nBalls; ++i) {
            auto & ball = balls[i];
            ball.r = 0.05f*frand() + 0.02f;
            ball.m = ball.r*ball.r*ball.r;

            ball.x = 2.0f*frand() - 1.0f;
            ball.y = 2.0f*frand() - 1.0f;
            ball.z = 2.0f*frand() - 1.0f;

            ball.vx = 2.0f*frand() - 1.0f;
            ball.vy = 2.0f*frand() - 1.0f;
            ball.vz = 2.0f*frand() - 1.0f;
        }
    }